

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.h
# Opt level: O0

bool QTest::qCompare<QPersistentModelIndex,QModelIndex>
               (QPersistentModelIndex *t1,QModelIndex *t2,char *actual,char *expected,char *file,
               int line)

{
  bool bVar1;
  void *in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  undefined1 success;
  void *in_R8;
  undefined4 in_R9D;
  char *in_stack_00000010;
  char *in_stack_00000018;
  char *in_stack_00000020;
  int in_stack_00000028;
  QModelIndex *in_stack_ffffffffffffffa8;
  QPersistentModelIndex *in_stack_ffffffffffffffb0;
  _func_char_ptr_void_ptr *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  success = (undefined1)((ulong)in_RSI >> 0x38);
  ::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar1 = compare_helper((bool)success,in_RDX,in_RCX,in_R8,
                         (_func_char_ptr_void_ptr *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8,in_stack_00000010,in_stack_00000018,
                         in_stack_00000020,in_stack_00000028);
  return bVar1;
}

Assistant:

inline bool qCompare(const T1 &t1, const T2 &t2, const char *actual, const char *expected,
                         const char *file, int line)
    {
        using Internal::genericToString;
        if constexpr (QtPrivate::is_standard_or_extended_integer_type_v<T1>
                      && QtPrivate::is_standard_or_extended_integer_type_v<T2>) {
            return compare_helper(q20::cmp_equal(t1, t2), "Compared values are not the same",
                                  std::addressof(t1), std::addressof(t2),
                                  genericToString<T1>, genericToString<T2>,
                                  actual, expected, file, line);
        } else {
            return compare_helper(t1 == t2, "Compared values are not the same",
                                  std::addressof(t1), std::addressof(t2),
                                  genericToString<T1>, genericToString<T2>,
                                  actual, expected, file, line);
        }
    }